

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

FloatMixTexture *
pbrt::FloatMixTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 local_a0 [16];
  undefined1 local_90 [8];
  NamedTextures *local_88;
  undefined1 local_78 [16];
  _Base_ptr local_68;
  _Base_ptr local_58 [2];
  _Base_ptr *local_48 [2];
  _Base_ptr local_38 [2];
  FloatMixTexture *pFVar2;
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"tex1","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)local_90,(string *)parameters,0.0,
             (memory_resource *)local_48);
  local_68 = (_Base_ptr)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"tex2","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)(local_a0 + 8),(string *)parameters,1.0,
             (memory_resource *)&local_68);
  local_88 = (NamedTextures *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"amount","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)local_a0,(string *)parameters,0.5,
             (memory_resource *)&local_88);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
  pFVar2 = (FloatMixTexture *)CONCAT44(extraout_var,iVar1);
  (pFVar2->tex1).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = (uintptr_t)local_90;
  (pFVar2->tex2).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_a0._8_8_;
  (pFVar2->amount).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_a0._0_8_;
  if (local_88 != (NamedTextures *)local_78) {
    operator_delete(local_88,local_78._0_8_ + 1);
  }
  if (local_68 != (_Base_ptr)local_58) {
    operator_delete(local_68,(ulong)((long)&local_58[0]->_M_color + 1));
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],(ulong)((long)&local_38[0]->_M_color + 1));
  }
  return pFVar2;
}

Assistant:

FloatMixTexture *FloatMixTexture::Create(const Transform &renderFromTexture,
                                         const TextureParameterDictionary &parameters,
                                         const FileLoc *loc, Allocator alloc) {
    return alloc.new_object<FloatMixTexture>(
        parameters.GetFloatTexture("tex1", 0.f, alloc),
        parameters.GetFloatTexture("tex2", 1.f, alloc),
        parameters.GetFloatTexture("amount", 0.5f, alloc));
}